

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation
          (cmExportBuildFileGenerator *this,string *name,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pbVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_60 [8];
  string c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *opt;
  ostream *os_local;
  string *name_local;
  cmExportBuildFileGenerator *this_local;
  
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1198ba7;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&(this->super_cmExportFileGenerator).Configurations);
  if (1 < sVar2) {
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)anon_var_dwarf_13ba080;
  }
  this_00 = &(this->super_cmExportFileGenerator).Configurations;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  c.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&c.field_2 + 8)), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string(local_60,(string *)pbVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=(local_60,"noconfig");
    }
    poVar5 = std::operator<<(os,"include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-");
    poVar5 = std::operator<<(poVar5,(string *)name);
    poVar5 = std::operator<<(poVar5,'-');
    poVar5 = std::operator<<(poVar5,local_60);
    poVar5 = std::operator<<(poVar5,".cmake\"");
    poVar5 = std::operator<<(poVar5,(char *)__range1);
    std::operator<<(poVar5,")\n");
    std::__cxx11::string::~string(local_60);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::GenerateCxxModuleConfigInformation(
  std::string const& name, std::ostream& os) const
{
  const char* opt = "";
  if (this->Configurations.size() > 1) {
    // With more than one configuration, each individual file is optional.
    opt = " OPTIONAL";
  }

  // Generate import file content for each configuration.
  for (std::string c : this->Configurations) {
    if (c.empty()) {
      c = "noconfig";
    }
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/cxx-modules-" << name << '-'
       << c << ".cmake\"" << opt << ")\n";
  }
}